

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

void al_set_new_display_adapter(int adapter)

{
  thread_local_state *ptVar1;
  int in_EDI;
  thread_local_state *tls;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    if (in_EDI < 0) {
      ptVar1->new_display_adapter = -1;
    }
    ptVar1->new_display_adapter = in_EDI;
  }
  return;
}

Assistant:

void al_set_new_display_adapter(int adapter)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   if (adapter < 0) {
      tls->new_display_adapter = ALLEGRO_DEFAULT_DISPLAY_ADAPTER;
   }
   tls->new_display_adapter = adapter;
}